

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleCharString.cpp
# Opt level: O0

SingleCharString * Js::SingleCharString::New(char16 ch,ScriptContext *scriptContext)

{
  code *pcVar1;
  char16 ch_00;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  SingleCharString *this;
  JavascriptLibrary *this_00;
  StaticType *type;
  TrackAllocData local_40;
  ScriptContext *local_18;
  ScriptContext *scriptContext_local;
  char16 ch_local;
  
  local_18 = scriptContext;
  scriptContext_local._6_2_ = ch;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SingleCharString.cpp"
                                ,0x17,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pRVar4 = ScriptContext::GetRecycler(local_18);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SingleCharString.cpp"
             ,0x1a);
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_40);
  this = (SingleCharString *)new<Memory::Recycler>(0x20,pRVar4,0x43c4b0);
  ch_00 = scriptContext_local._6_2_;
  this_00 = ScriptContext::GetLibrary(local_18);
  type = JavascriptLibrary::GetStringTypeStatic(this_00);
  SingleCharString(this,ch_00,type);
  return this;
}

Assistant:

SingleCharString* SingleCharString::New(char16 ch, ScriptContext* scriptContext)
    {
        Assert(scriptContext != nullptr);

        return RecyclerNew(scriptContext->GetRecycler(),SingleCharString,ch,
            scriptContext->GetLibrary()->GetStringTypeStatic());
    }